

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
GenericUploadRenderTimeCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
::runSample(GenericUploadRenderTimeCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            *this,SampleResult *sample)

{
  pointer *ppuVar1;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  deInt32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  deUint64 dVar11;
  Exception *this_00;
  UnmapFailureError *this_01;
  deUint64 dVar12;
  long lVar13;
  PixelBufferAccess local_180;
  int local_158;
  undefined1 local_152;
  allocator<char> local_151;
  int unrelatedUploadSize;
  char local_129;
  void *pvStack_128;
  GLboolean unmapSuccessful;
  void *mapPtr;
  reference local_118;
  void *source;
  GLintptr offset;
  GLsizeiptr size;
  undefined1 local_f8 [4];
  GLenum target;
  Buffer vertexCopyBuffer;
  GLenum indexDataUsage;
  GLenum vertexDataUsage;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertexData;
  deUint64 endTime;
  deUint64 startTime;
  Surface resultSurface;
  undefined1 local_78 [4];
  int numVertices;
  Buffer unrelatedBuffer;
  undefined1 local_50 [8];
  Buffer indexBuffer;
  Buffer arrayBuffer;
  Functions *gl;
  SampleResult *sample_local;
  GenericUploadRenderTimeCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
  *this_local;
  long lVar7;
  
  pRVar6 = Context::getRenderContext
                     ((this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                      ).super_RenderPerformanceTestBase.super_TestCase.m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  pRVar6 = Context::getRenderContext
                     ((this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                      ).super_RenderPerformanceTestBase.super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&indexBuffer.super_ObjectWrapper.m_object,
             pRVar6);
  pRVar6 = Context::getRenderContext
                     ((this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                      ).super_RenderPerformanceTestBase.super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_50,pRVar6);
  pRVar6 = Context::getRenderContext
                     ((this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                      ).super_RenderPerformanceTestBase.super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_78,pRVar6);
  resultSurface.m_pixels.m_cap._4_4_ = getLayeredGridNumVertices(&sample->scene);
  tcu::Surface::Surface((Surface *)&startTime,0x80,0x80);
  ppuVar1 = &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)ppuVar1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&indexDataUsage);
  generateLayeredGridVertexAttribData4C4V
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)ppuVar1,
             &sample->scene);
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>).
      m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    generateLayeredGridIndexData
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&indexDataUsage,&sample->scene
              );
  }
  pcVar2 = *(code **)(lVar7 + 0x40);
  dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&indexBuffer.super_ObjectWrapper.m_object);
  (*pcVar2)(0x8892,dVar4);
  pcVar2 = *(code **)(lVar7 + 0x40);
  dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_50);
  (*pcVar2)(0x8893,dVar4);
  RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
  if (((this->
       super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>).
       m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) && (this->m_bufferState == BUFFERSTATE_EXISTING)) {
    pcVar2 = *(code **)(lVar7 + 0x150);
    ppuVar1 = &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    sVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       ppuVar1);
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        ppuVar1,0);
    (*pcVar2)(0x8892,sVar8 << 4,pvVar9,0x88e8);
    (**(code **)(lVar7 + 0x538))(4,0,resultSurface.m_pixels.m_cap._4_4_);
  }
  else if (((this->
            super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            ).m_drawMethod != DRAWMETHOD_DRAW_ARRAYS) || (this->m_bufferState != BUFFERSTATE_NEW)) {
    if (((this->
         super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
         ).m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) &&
       (this->m_bufferState == BUFFERSTATE_EXISTING)) {
      vertexCopyBuffer.super_ObjectWrapper._20_4_ =
           (uint)(*(int *)&(this->
                           super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                           ).field_0xcc == 0) * 4 + 0x88e4;
      vertexCopyBuffer.super_ObjectWrapper.m_object =
           (uint)(*(int *)&(this->
                           super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                           ).field_0xcc == 1) * 4 + 0x88e4;
      pcVar2 = *(code **)(lVar7 + 0x150);
      ppuVar1 = &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      sVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                        ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         ppuVar1);
      pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          ppuVar1,0);
      (*pcVar2)(0x8892,sVar8 << 4,pvVar9,vertexCopyBuffer.super_ObjectWrapper._20_4_);
      pcVar2 = *(code **)(lVar7 + 0x150);
      sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&indexDataUsage);
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&indexDataUsage,0)
      ;
      (*pcVar2)(0x8893,sVar8 << 2,pvVar10,vertexCopyBuffer.super_ObjectWrapper.m_object);
      (**(code **)(lVar7 + 0x568))(4,resultSurface.m_pixels.m_cap._4_4_,0x1405,0);
    }
    else if (((this->
              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
              ).m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) &&
            (this->m_bufferState == BUFFERSTATE_NEW)) {
      if (*(int *)&(this->
                   super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                   ).field_0xcc == 0) {
        pRVar6 = Context::getRenderContext
                           ((this->
                            super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                            ).super_RenderPerformanceTestBase.super_TestCase.m_context);
        glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
                  ((TypedObjectWrapper<(glu::ObjectType)1> *)local_f8,pRVar6);
        pcVar2 = *(code **)(lVar7 + 0x40);
        dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_f8);
        (*pcVar2)(0x8892,dVar4);
        RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
        pcVar2 = *(code **)(lVar7 + 0x150);
        ppuVar1 = &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage;
        sVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                          ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )ppuVar1);
        pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)ppuVar1,0);
        (*pcVar2)(0x8892,sVar8 << 4,pvVar9,0x88e4);
        pcVar2 = *(code **)(lVar7 + 0x150);
        sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&indexDataUsage);
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&indexDataUsage,
                             0);
        (*pcVar2)(0x8893,sVar8 << 2,pvVar10,0x88e4);
        (**(code **)(lVar7 + 0x568))(4,resultSurface.m_pixels.m_cap._4_4_,0x1405,0);
        pcVar2 = *(code **)(lVar7 + 0x40);
        dVar4 = glu::ObjectWrapper::operator*
                          ((ObjectWrapper *)&indexBuffer.super_ObjectWrapper.m_object);
        (*pcVar2)(0x8892,dVar4);
        RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
        glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                  ((TypedObjectWrapper<(glu::ObjectType)1> *)local_f8);
      }
      else if (*(int *)&(this->
                        super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                        ).field_0xcc == 1) {
        pcVar2 = *(code **)(lVar7 + 0x150);
        ppuVar1 = &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage;
        sVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                          ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )ppuVar1);
        pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)ppuVar1,0);
        (*pcVar2)(0x8892,sVar8 << 4,pvVar9,0x88e4);
        (**(code **)(lVar7 + 0x538))(4,0,resultSurface.m_pixels.m_cap._4_4_);
      }
    }
  }
  RenderPerformanceTestBase::waitGLResults((RenderPerformanceTestBase *)this);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"post buffer prepare",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                  ,0x1323);
  (**(code **)(lVar7 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar7 + 0x188))(0x4000);
  RenderPerformanceTestBase::waitGLResults((RenderPerformanceTestBase *)this);
  tcu::warmupCPU();
  source = (void *)0x0;
  if ((*(int *)&(this->
                super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                ).field_0xcc == 0) && (this->m_uploadRange == UPLOADRANGE_FULL)) {
    size._4_4_ = 0x8892;
    sVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    offset = sVar8 << 4;
    local_118 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )&indexData.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,0);
  }
  else if ((*(int *)&(this->
                     super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                     ).field_0xcc == 1) && (this->m_uploadRange == UPLOADRANGE_FULL)) {
    size._4_4_ = 0x8893;
    sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&indexDataUsage);
    offset = sVar8 << 2;
    local_118 = (reference)
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&indexDataUsage,0)
    ;
  }
  else if ((*(int *)&(this->
                     super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                     ).field_0xcc == 0) && (this->m_uploadRange == UPLOADRANGE_PARTIAL)) {
    size._4_4_ = 0x8892;
    sVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    dVar5 = deAlign32((deInt32)((long)((ulong)(uint)((int)(sVar8 << 4) >> 0x1f) << 0x20 |
                                      sVar8 << 4 & 0xffffffff) / 2),4);
    offset = (GLintptr)dVar5;
    dVar5 = deAlign32(dVar5 / 2,4);
    source = (void *)(long)dVar5;
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    local_118 = (reference)((long)pvVar9->m_data + (long)source);
  }
  else {
    if ((*(int *)&(this->
                  super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                  ).field_0xcc != 1) || (this->m_uploadRange != UPLOADRANGE_PARTIAL)) {
      mapPtr._4_4_ = 1;
      goto LAB_00c5c8ce;
    }
    size._4_4_ = 0x8893;
    sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&indexDataUsage);
    dVar5 = deAlign32((deInt32)((long)((ulong)(uint)((int)(sVar8 << 2) >> 0x1f) << 0x20 |
                                      sVar8 << 2 & 0xffffffff) / 2),4);
    offset = (GLintptr)dVar5;
    dVar5 = deAlign32(dVar5 / 2,4);
    source = (void *)(long)dVar5;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&indexDataUsage,0);
    local_118 = (reference)((long)pvVar10 + (long)source);
  }
  dVar11 = deGetMicroseconds();
  if (this->m_uploadMethod == UPLOADMETHOD_BUFFER_DATA) {
    (**(code **)(lVar7 + 0x150))(size._4_4_,offset,local_118,0x88e8);
  }
  else if (this->m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA) {
    if (this->m_bufferState == BUFFERSTATE_NEW) {
      (**(code **)(lVar7 + 0x150))(size._4_4_,offset,0,0x88e8);
    }
    (**(code **)(lVar7 + 0x168))(size._4_4_,source,offset,local_118);
  }
  else if (this->m_uploadMethod == UPLOADMETHOD_MAP_BUFFER_RANGE) {
    if (this->m_bufferState == BUFFERSTATE_NEW) {
      (**(code **)(lVar7 + 0x150))(size._4_4_,offset,0,0x88e8);
    }
    pvStack_128 = (void *)(**(code **)(lVar7 + 0xd00))(size._4_4_,source,offset,0x2e);
    if (pvStack_128 == (void *)0x0) {
      local_152 = 1;
      this_00 = (Exception *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&unrelatedUploadSize,"MapBufferRange returned NULL",&local_151);
      tcu::Exception::Exception(this_00,(string *)&unrelatedUploadSize);
      local_152 = 0;
      __cxa_throw(this_00,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
    }
    ::deMemcpy(pvStack_128,local_118,(long)(int)offset);
    local_129 = (**(code **)(lVar7 + 0x1670))(size._4_4_);
    if (local_129 == '\0') {
      this_01 = (UnmapFailureError *)__cxa_allocate_exception(8);
      UnmapFailureError::UnmapFailureError(this_01);
      __cxa_throw(this_01,&Performance::(anonymous_namespace)::UnmapFailureError::typeinfo,
                  UnmapFailureError::~UnmapFailureError);
    }
  }
  dVar12 = deGetMicroseconds();
  (sample->result).uploadedDataSize = (int)offset;
  (sample->result).duration.uploadDuration = dVar12 - dVar11;
  if (this->m_unrelatedBufferType == UNRELATEDBUFFERTYPE_VERTEX) {
    sVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_158 = (int)sVar8 << 4;
    pcVar2 = *(code **)(lVar7 + 0x40);
    dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_78);
    (*pcVar2)(0x8892,dVar4);
    pcVar2 = *(code **)(lVar7 + 0x150);
    lVar13 = (long)local_158;
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    (*pcVar2)(0x8892,lVar13,pvVar9,0x88e4);
    (sample->result).unrelatedDataSize = local_158;
  }
  dVar11 = deGetMicroseconds();
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>).
      m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) {
    (**(code **)(lVar7 + 0x538))(4,0,resultSurface.m_pixels.m_cap._4_4_);
  }
  else if ((this->
           super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
           ).m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    (**(code **)(lVar7 + 0x568))(4,resultSurface.m_pixels.m_cap._4_4_,0x1405,0);
  }
  dVar12 = deGetMicroseconds();
  (sample->result).duration.renderDuration = dVar12 - dVar11;
  dVar11 = deGetMicroseconds();
  pRVar6 = Context::getRenderContext
                     ((this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                      ).super_RenderPerformanceTestBase.super_TestCase.m_context);
  tcu::Surface::getAccess(&local_180,(Surface *)&startTime);
  glu::readPixels(pRVar6,0,0,&local_180);
  dVar12 = deGetMicroseconds();
  (sample->result).duration.readDuration = dVar12 - dVar11;
  iVar3 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::
          getVertexDataSize(&this->
                             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                           );
  (sample->result).renderDataSize = iVar3 * (sample->result).numVertices;
  (sample->result).duration.renderReadDuration =
       (sample->result).duration.renderDuration + (sample->result).duration.readDuration;
  (sample->result).duration.totalDuration =
       (sample->result).duration.uploadDuration + (sample->result).duration.renderDuration +
       (sample->result).duration.readDuration;
  (sample->result).duration.fitResponseDuration = (sample->result).duration.renderReadDuration;
  mapPtr._4_4_ = 0;
LAB_00c5c8ce:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&indexDataUsage);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  tcu::Surface::~Surface((Surface *)&startTime);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_78);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_50);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&indexBuffer.super_ObjectWrapper.m_object);
  return;
}

Assistant:

void GenericUploadRenderTimeCase<SampleType>::runSample (SampleResult& sample)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const glu::Buffer		arrayBuffer			(m_context.getRenderContext());
	const glu::Buffer		indexBuffer			(m_context.getRenderContext());
	const glu::Buffer		unrelatedBuffer		(m_context.getRenderContext());
	const int				numVertices			= getLayeredGridNumVertices(sample.scene);
	tcu::Surface			resultSurface		(RENDER_AREA_SIZE, RENDER_AREA_SIZE);
	deUint64				startTime;
	deUint64				endTime;
	std::vector<tcu::Vec4>	vertexData;
	std::vector<deUint32>	indexData;

	// create data

	generateLayeredGridVertexAttribData4C4V(vertexData, sample.scene);
	if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
		generateLayeredGridIndexData(indexData, sample.scene);

	gl.bindBuffer(GL_ARRAY_BUFFER, *arrayBuffer);
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, *indexBuffer);
	RenderCase<SampleType>::setupVertexAttribs();

	// target should be an exisiting buffer? Draw from it once to make sure it exists on the gpu

	if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS && m_bufferState == BUFFERSTATE_EXISTING)
	{
		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], GL_DYNAMIC_DRAW);
		gl.drawArrays(GL_TRIANGLES, 0, numVertices);
	}
	else if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS && m_bufferState == BUFFERSTATE_NEW)
	{
		// do not touch the vertex buffer
	}
	else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS && m_bufferState == BUFFERSTATE_EXISTING)
	{
		// hint that the target buffer will be modified soon
		const glw::GLenum vertexDataUsage	= (m_targetBuffer == TARGETBUFFER_VERTEX) ? (GL_DYNAMIC_DRAW) : (GL_STATIC_DRAW);
		const glw::GLenum indexDataUsage	= (m_targetBuffer == TARGETBUFFER_INDEX) ? (GL_DYNAMIC_DRAW) : (GL_STATIC_DRAW);

		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], vertexDataUsage);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(indexData.size() * sizeof(deUint32)), &indexData[0], indexDataUsage);
		gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
	}
	else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS && m_bufferState == BUFFERSTATE_NEW)
	{
		if (m_targetBuffer == TARGETBUFFER_VERTEX)
		{
			// make the index buffer present on the gpu
			// use another vertex buffer to keep original buffer in unused state
			const glu::Buffer vertexCopyBuffer(m_context.getRenderContext());

			gl.bindBuffer(GL_ARRAY_BUFFER, *vertexCopyBuffer);
			RenderCase<SampleType>::setupVertexAttribs();

			gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], GL_STATIC_DRAW);
			gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(indexData.size() * sizeof(deUint32)), &indexData[0], GL_STATIC_DRAW);
			gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);

			// restore original state
			gl.bindBuffer(GL_ARRAY_BUFFER, *arrayBuffer);
			RenderCase<SampleType>::setupVertexAttribs();
		}
		else if (m_targetBuffer == TARGETBUFFER_INDEX)
		{
			// make the vertex buffer present on the gpu
			gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], GL_STATIC_DRAW);
			gl.drawArrays(GL_TRIANGLES, 0, numVertices);
		}
		else
			DE_ASSERT(false);
	}
	else
		DE_ASSERT(false);

	RenderCase<SampleType>::waitGLResults();
	GLU_EXPECT_NO_ERROR(gl.getError(), "post buffer prepare");

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	RenderCase<SampleType>::waitGLResults();

	tcu::warmupCPU();

	// upload

	{
		glw::GLenum		target;
		glw::GLsizeiptr	size;
		glw::GLintptr	offset = 0;
		const void*		source;

		if (m_targetBuffer == TARGETBUFFER_VERTEX && m_uploadRange == UPLOADRANGE_FULL)
		{
			target	= GL_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4));
			source	= &vertexData[0];
		}
		else if (m_targetBuffer == TARGETBUFFER_INDEX && m_uploadRange == UPLOADRANGE_FULL)
		{
			target	= GL_ELEMENT_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)(indexData.size() * sizeof(deUint32));
			source	= &indexData[0];
		}
		else if (m_targetBuffer == TARGETBUFFER_VERTEX && m_uploadRange == UPLOADRANGE_PARTIAL)
		{
			DE_ASSERT(m_bufferState == BUFFERSTATE_EXISTING);

			target	= GL_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)deAlign32((int)(vertexData.size() * sizeof(tcu::Vec4)) / 2, 4);
			offset	= (glw::GLintptr)deAlign32((int)size / 2, 4);
			source	= (const deUint8*)&vertexData[0] + offset;
		}
		else if (m_targetBuffer == TARGETBUFFER_INDEX && m_uploadRange == UPLOADRANGE_PARTIAL)
		{
			DE_ASSERT(m_bufferState == BUFFERSTATE_EXISTING);

			// upload to 25% - 75% range
			target	= GL_ELEMENT_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)deAlign32((deInt32)(indexData.size() * sizeof(deUint32)) / 2, 4);
			offset	= (glw::GLintptr)deAlign32((int)size / 2, 4);
			source	= (const deUint8*)&indexData[0] + offset;
		}
		else
		{
			DE_ASSERT(false);
			return;
		}

		startTime = deGetMicroseconds();

		if (m_uploadMethod == UPLOADMETHOD_BUFFER_DATA)
			gl.bufferData(target, size, source, GL_DYNAMIC_DRAW);
		else if (m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA)
		{
			// create buffer storage
			if (m_bufferState == BUFFERSTATE_NEW)
				gl.bufferData(target, size, DE_NULL, GL_DYNAMIC_DRAW);
			gl.bufferSubData(target, offset, size, source);
		}
		else if (m_uploadMethod == UPLOADMETHOD_MAP_BUFFER_RANGE)
		{
			void*			mapPtr;
			glw::GLboolean	unmapSuccessful;

			// create buffer storage
			if (m_bufferState == BUFFERSTATE_NEW)
				gl.bufferData(target, size, DE_NULL, GL_DYNAMIC_DRAW);

			mapPtr = gl.mapBufferRange(target, offset, size, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_RANGE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT | GL_MAP_UNSYNCHRONIZED_BIT);
			if (!mapPtr)
				throw tcu::Exception("MapBufferRange returned NULL");

			deMemcpy(mapPtr, source, (int)size);

			// if unmapping fails, just try again later
			unmapSuccessful = gl.unmapBuffer(target);
			if (!unmapSuccessful)
				throw UnmapFailureError();
		}
		else
			DE_ASSERT(false);

		endTime = deGetMicroseconds();

		sample.result.uploadedDataSize = (int)size;
		sample.result.duration.uploadDuration = endTime - startTime;
	}

	// unrelated
	if (m_unrelatedBufferType == UNRELATEDBUFFERTYPE_VERTEX)
	{
		const int unrelatedUploadSize = (int)(vertexData.size() * sizeof(tcu::Vec4));

		gl.bindBuffer(GL_ARRAY_BUFFER, *unrelatedBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, unrelatedUploadSize, &vertexData[0], GL_STATIC_DRAW);
		// Attibute pointers are not modified, no need restore state

		sample.result.unrelatedDataSize = unrelatedUploadSize;
	}

	// draw
	{
		startTime = deGetMicroseconds();

		if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
			gl.drawArrays(GL_TRIANGLES, 0, numVertices);
		else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
			gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
		else
			DE_ASSERT(false);

		endTime = deGetMicroseconds();

		sample.result.duration.renderDuration = endTime - startTime;
	}

	// read
	{
		startTime = deGetMicroseconds();
		glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());
		endTime = deGetMicroseconds();

		sample.result.duration.readDuration = endTime - startTime;
	}

	// set results

	sample.result.renderDataSize = RenderCase<SampleType>::getVertexDataSize() * sample.result.numVertices;

	sample.result.duration.renderReadDuration = sample.result.duration.renderDuration + sample.result.duration.readDuration;
	sample.result.duration.totalDuration = sample.result.duration.uploadDuration + sample.result.duration.renderDuration + sample.result.duration.readDuration;
	sample.result.duration.fitResponseDuration = sample.result.duration.renderReadDuration;
}